

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall
QDockWidgetTitleButton::paintEvent(QDockWidgetTitleButton *this,QPaintEvent *param_1)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_e0 [8];
  QStylePainter local_d8;
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.wstyle = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter(&local_d8,(QWidget *)this);
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  QStyleOption::initFrom((QStyleOption *)&opt,(QWidget *)this);
  opt.super_QStyleOptionComplex.super_QStyleOption.state.
  super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
       opt.super_QStyleOptionComplex.super_QStyleOption.state.
       super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
       _1_1_ | 0x10;
  pQVar4 = QWidget::style((QWidget *)this);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x5d,0,this,0);
  if (iVar3 == 0) {
    bVar2 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (!bVar2) {
      bVar2 = QAbstractButton::isChecked(&this->super_QAbstractButton);
      if (!bVar2) goto LAB_003d4793;
    }
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
         (byte)opt.super_QStyleOptionComplex.super_QStyleOption.state.
               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 0x24;
  }
  else {
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 3) == 2) {
      bVar2 = QAbstractButton::isChecked(&this->super_QAbstractButton);
      if (!bVar2) {
        bVar2 = QAbstractButton::isDown(&this->super_QAbstractButton);
        if (!bVar2) {
          opt.super_QStyleOptionComplex.super_QStyleOption.state.
          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i.
          _0_1_ = (byte)opt.super_QStyleOptionComplex.super_QStyleOption.state.
                        super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i | 2;
        }
      }
    }
    bVar2 = QAbstractButton::isChecked(&this->super_QAbstractButton);
    if (bVar2) {
      opt.super_QStyleOptionComplex.super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_
           = (byte)opt.super_QStyleOptionComplex.super_QStyleOption.state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i | 0x20;
    }
    bVar2 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (bVar2) {
      opt.super_QStyleOptionComplex.super_QStyleOption.state.
      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_1_
           = (byte)opt.super_QStyleOptionComplex.super_QStyleOption.state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
    QStylePainter::drawPrimitive(&local_d8,PE_PanelButtonTool,(QStyleOption *)&opt);
  }
LAB_003d4793:
  QAbstractButton::icon((QAbstractButton *)local_e0);
  QIcon::operator=(&opt.icon,(QIcon *)local_e0);
  QIcon::~QIcon((QIcon *)local_e0);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  opt.super_QStyleOptionComplex.activeSubControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  opt.features.super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
  super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i =
       (QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>)
       (QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>)0x0;
  opt.arrowType = NoArrow;
  opt.iconSize = dockButtonIconSize(this);
  QStylePainter::drawComplexControl(&local_d8,CC_ToolButton,&opt.super_QStyleOptionComplex);
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  QPainter::~QPainter(&local_d8.super_QPainter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetTitleButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);

    QStyleOptionToolButton opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;

    if (style()->styleHint(QStyle::SH_DockWidget_ButtonsHaveFrame, nullptr, this)) {
        if (isEnabled() && underMouse() && !isChecked() && !isDown())
            opt.state |= QStyle::State_Raised;
        if (isChecked())
            opt.state |= QStyle::State_On;
        if (isDown())
            opt.state |= QStyle::State_Sunken;
        p.drawPrimitive(QStyle::PE_PanelButtonTool, opt);
    } else if (isDown() || isChecked()) {
        // no frame, but the icon might have explicit pixmaps for QIcon::On
        opt.state |= QStyle::State_On | QStyle::State_Sunken;
    }

    opt.icon = icon();
    opt.subControls = { };
    opt.activeSubControls = { };
    opt.features = QStyleOptionToolButton::None;
    opt.arrowType = Qt::NoArrow;
    opt.iconSize = dockButtonIconSize();
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}